

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalReadFile
                    (CPalThread *pThread,HANDLE hFile,LPVOID lpBuffer,DWORD nNumberOfBytesToRead,
                    LPDWORD lpNumberOfBytesRead,LPOVERLAPPED lpOverlapped)

{
  ssize_t sVar1;
  int *piVar2;
  LONG local_6c;
  int res;
  LONG readOffsetStartHigh;
  LONG readOffsetStartLow;
  int ifd;
  IFileTransactionLock *pTransactionLock;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  LPOVERLAPPED pvStack_38;
  PAL_ERROR palError;
  LPOVERLAPPED lpOverlapped_local;
  LPDWORD lpNumberOfBytesRead_local;
  LPVOID pvStack_20;
  DWORD nNumberOfBytesToRead_local;
  LPVOID lpBuffer_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pTransactionLock = (IFileTransactionLock *)0x0;
  _readOffsetStartLow = (undefined8 *)0x0;
  res = 0;
  local_6c = 0;
  pvStack_38 = lpOverlapped;
  lpOverlapped_local = lpNumberOfBytesRead;
  lpNumberOfBytesRead_local._4_4_ = nNumberOfBytesToRead;
  pvStack_20 = lpBuffer;
  lpBuffer_local = hFile;
  hFile_local = pThread;
  if (lpNumberOfBytesRead == (LPDWORD)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 0x57;
  }
  else {
    *lpNumberOfBytesRead = 0;
    if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pFileObject._4_4_ = 6;
    }
    else if (lpOverlapped == (LPOVERLAPPED)0x0) {
      if (lpBuffer == (LPVOID)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pFileObject._4_4_ = 0x3e6;
      }
      else {
        pFileObject._4_4_ =
             (**(code **)(*g_pObjectManager + 0x28))
                       (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
        if ((pFileObject._4_4_ == 0) &&
           (pFileObject._4_4_ =
                 (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                           (pLocalData,hFile_local,0,&pTransactionLock,&pLocalDataLock),
           pFileObject._4_4_ == 0)) {
          if (*(int *)((long)&pLocalDataLock[2]._vptr_IDataLock + 4) == 1) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pFileObject._4_4_ = 5;
          }
          else {
            readOffsetStartHigh = *(LONG *)&pLocalDataLock[1]._vptr_IDataLock;
            if (pLocalDataLock->_vptr_IDataLock != (_func_int **)0x0) {
              pFileObject._4_4_ =
                   InternalSetFilePointerForUnixFd(readOffsetStartHigh,0,&local_6c,1,&res);
              if (pFileObject._4_4_ != 0) {
                fprintf(_stderr,"] %s %s:%d","InternalReadFile",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                        ,0x92f);
                fprintf(_stderr,"Failed to get the current file position\n");
                pFileObject._4_4_ = 0x54f;
                goto LAB_003b0da4;
              }
              pFileObject._4_4_ =
                   (**(code **)*pLocalDataLock->_vptr_IDataLock)
                             (pLocalDataLock->_vptr_IDataLock,hFile_local,0,res,local_6c,
                              lpNumberOfBytesRead_local._4_4_,0,&readOffsetStartLow);
              if (pFileObject._4_4_ != 0) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                goto LAB_003b0da4;
              }
            }
            (**pTransactionLock->_vptr_IFileTransactionLock)(pTransactionLock,hFile_local,0);
            pTransactionLock = (IFileTransactionLock *)0x0;
            pLocalDataLock = (IDataLock *)0x0;
            do {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              sVar1 = read(readOffsetStartHigh,pvStack_20,(ulong)lpNumberOfBytesRead_local._4_4_);
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if (-1 < (int)sVar1) {
                *(int *)lpOverlapped_local = (int)sVar1;
                goto LAB_003b0da4;
              }
              piVar2 = __errno_location();
            } while (*piVar2 == 4);
            pFileObject._4_4_ = FILEGetLastErrorFromErrno();
          }
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalReadFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x8f0);
      fprintf(_stderr,"lpOverlapped is not NULL, as it should be.\n");
      pFileObject._4_4_ = 0x57;
    }
  }
LAB_003b0da4:
  if (_readOffsetStartLow != (undefined8 *)0x0) {
    (**(code **)*_readOffsetStartLow)();
  }
  if (pTransactionLock != (IFileTransactionLock *)0x0) {
    (**pTransactionLock->_vptr_IFileTransactionLock)(pTransactionLock,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalReadFile(
    CPalThread *pThread,
    HANDLE hFile,
    LPVOID lpBuffer,
    DWORD nNumberOfBytesToRead,
    LPDWORD lpNumberOfBytesRead,
    LPOVERLAPPED lpOverlapped
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    IFileTransactionLock *pTransactionLock = NULL;
    int ifd;
    
    LONG readOffsetStartLow = 0, readOffsetStartHigh = 0;
    int res;

    if (NULL != lpNumberOfBytesRead)
    {
        //
        // This must be set to 0 before any other error checking takes
        // place, per MSDN
        //

        *lpNumberOfBytesRead = 0;        
    }
    else
    {
        ERROR( "lpNumberOfBytesRead is NULL\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }
    else if (NULL != lpOverlapped)
    {
        ASSERT( "lpOverlapped is not NULL, as it should be.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }
    else if (NULL == lpBuffer)
    {
        ERROR( "Invalid parameter. (lpBuffer:%p)\n", lpBuffer);
        palError = ERROR_NOACCESS;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }

    ifd = pLocalData->unix_fd;

    //
    // Inform the lock controller for this file (if any) of our intention
    // to perform a read. (Note that pipes don't have lock controllers.)
    //
    
    if (NULL != pLocalData->pLockController)
    {
        /* Get the current file position to calculate the region to lock */
        palError = InternalSetFilePointerForUnixFd(
            ifd,
            0,
            &readOffsetStartHigh,
            FILE_CURRENT,
            &readOffsetStartLow
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Failed to get the current file position\n");
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        palError = pLocalData->pLockController->GetTransactionLock(
            pThread,
            IFileLockController::ReadLock,
            readOffsetStartLow,
            readOffsetStartHigh,
            nNumberOfBytesToRead,
            0,
            &pTransactionLock
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to obtain read transaction lock");
            goto done;
        }
    }

    //
    // Release the data lock before performing the (possibly blocking)
    // read call
    //

    pLocalDataLock->ReleaseLock(pThread, FALSE);
    pLocalDataLock = NULL;
    pLocalData = NULL;

Read:
    TRACE("Reading from file descriptor %d\n", ifd);
    res = read(ifd, lpBuffer, nNumberOfBytesToRead);
    TRACE("read() returns %d\n", res);

    if (res >= 0)
    {
        *lpNumberOfBytesRead = res;
    }
    else if (errno == EINTR)
    {
        // Try to read again.
        goto Read;
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    
done:

    if (NULL != pTransactionLock)
    {
        pTransactionLock->ReleaseLock();
    }

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}